

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O3

void NVMDumpCode(FILE *f,uint8_t *bc,uint32_t len)

{
  byte bVar1;
  ushort len_00;
  ushort b;
  uint32_t pc;
  ulong uVar2;
  
  if (len != 0) {
    uVar2 = 0;
    do {
      pc = (uint32_t)uVar2;
      bVar1 = bc[uVar2];
      b = bVar1 & 7;
      if ((char)b == '\a') {
        b = CONCAT11(bc[uVar2 + 1],bc[pc + 2]);
        len_00 = 3;
        if ((bVar1 < 8) && (b == 1)) {
          b = 7;
        }
      }
      else {
        len_00 = 1;
      }
      NVMDumpInstCode(f,bc,pc,len_00);
      NVMDumpInstName(f,bVar1 >> 3,b);
      NewtFprintf(f,"\n");
      uVar2 = (ulong)(pc + len_00);
    } while (pc + len_00 < len);
  }
  return;
}

Assistant:

void NVMDumpCode(FILE * f, uint8_t * bc, uint32_t len)
{
    uint8_t	op;
    uint8_t	a;
    int16_t	b;
    uint16_t	oplen;
    uint32_t	pc = 0;

    while (pc < len)
    {
        op = bc[pc];
        b = op & kNBCFieldMask;
        a = (op & 0xff)>>3;

        if (b == kNBCFieldMask)
        {
            oplen = 3;

            b = (int16_t)bc[pc + 1] << 8;
            b += bc[pc + 2];

            if (a == 0)
            {
                if (b == 0x01)
                    b = kNBCFieldMask;
            }
        }
        else
        {
            oplen = 1;
        }

        NVMDumpInstCode(f, bc, pc, oplen);
        NVMDumpInstName(f, a, b);
        NewtFprintf(f, "\n");

        pc += oplen;
    }
}